

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

stage * __thiscall
mpt::unique_array<mpt::cycle::stage>::get(unique_array<mpt::cycle::stage> *this,long pos)

{
  content<mpt::cycle::stage> *pcVar1;
  ulong uVar2;
  content<mpt::cycle::stage> *pcVar3;
  
  pcVar3 = (this->_ref)._ref;
  if (pos < 0) {
    if (pcVar3 == (content<mpt::cycle::stage> *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (pcVar3->super_buffer)._used >> 5;
    }
    pos = pos + uVar2;
    if (-1 < pos) goto LAB_00131374;
  }
  else {
    if (pcVar3 == (content<mpt::cycle::stage> *)0x0) {
      uVar2 = 0;
    }
    else {
      uVar2 = (pcVar3->super_buffer)._used >> 5;
    }
    if (pos < (long)uVar2) {
LAB_00131374:
      pcVar1 = (this->_ref)._ref;
      pcVar3 = pcVar1 + 1;
      if (pcVar1 == (content<mpt::cycle::stage> *)0x0) {
        pcVar3 = (content<mpt::cycle::stage> *)0x0;
      }
      return (stage *)(pcVar3 + pos);
    }
  }
  return (stage *)0x0;
}

Assistant:

T *get(long pos) const
	{
		if (pos < 0) {
			if ((pos += length()) < 0) {
				return 0;
			}
		}
		else if (pos >= length()) {
			return 0;
		}
		return begin() + pos;
	}